

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::AsyncOutputStream,_std::nullptr_t> __thiscall
kj::anon_unknown_36::HttpClientAdapter::ConnectResponseImpl::reject
          (ConnectResponseImpl *this,uint statusCode,StringPtr statusText,HttpHeaders *headers,
          Maybe<unsigned_long> *expectedBodySize)

{
  StringPtr statusText_00;
  HttpHeaders *headers_00;
  uint statusCode_00;
  bool bVar1;
  Own<kj::AsyncInputStream,_std::nullptr_t> *t;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *other;
  AsyncOutputStream *extraout_RDX;
  undefined4 in_register_00000034;
  Own<kj::AsyncOutputStream,_std::nullptr_t> OVar2;
  bool local_e9;
  Maybe<kj::Own<kj::AsyncInputStream,_std::nullptr_t>_> local_e8;
  ConnectResponseImpl *local_d8;
  char *pcStack_d0;
  Maybe<unsigned_long> local_c0;
  undefined1 local_b0 [8];
  OneWayPipe pipe;
  Fault local_80;
  Fault f;
  uint *local_70;
  DebugComparison<unsigned_int_&,_int> local_68;
  bool local_39;
  HttpHeaders *pHStack_38;
  bool _kjCondition;
  HttpHeaders *headers_local;
  ConnectResponseImpl *pCStack_28;
  uint statusCode_local;
  ConnectResponseImpl *this_local;
  StringPtr statusText_local;
  
  this_local = (ConnectResponseImpl *)statusText.content.size_;
  headers_local._4_4_ = (uint)statusText.content.ptr;
  pHStack_38 = (HttpHeaders *)expectedBodySize;
  pCStack_28 = (ConnectResponseImpl *)CONCAT44(in_register_00000034,statusCode);
  statusText_local.content.ptr = (char *)headers;
  statusText_local.content.size_ = (size_t)this;
  local_70 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (uint *)((long)&headers_local + 4));
  f.exception._4_4_ = 200;
  kj::_::DebugExpression<unsigned_int&>::operator<
            (&local_68,(DebugExpression<unsigned_int&> *)&local_70,(int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_68);
  local_e9 = bVar1 || 299 < headers_local._4_4_;
  local_39 = local_e9;
  if (bVar1 || 299 < headers_local._4_4_) {
    Maybe<unsigned_long>::Maybe();
    newOneWayPipe((OneWayPipe *)local_b0,&local_c0);
    Maybe<unsigned_long>::~Maybe(&local_c0);
    statusCode_00 = headers_local._4_4_;
    headers_00 = pHStack_38;
    local_d8 = this_local;
    pcStack_d0 = statusText_local.content.ptr;
    t = mv<kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                  ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_b0);
    Maybe<kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>::Maybe(&local_e8,t);
    statusText_00.content.size_ = (size_t)pcStack_d0;
    statusText_00.content.ptr = (char *)local_d8;
    respond((ConnectResponseImpl *)CONCAT44(in_register_00000034,statusCode),statusCode_00,
            statusText_00,headers_00,&local_e8);
    Maybe<kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>::~Maybe(&local_e8);
    other = mv<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
                      ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)&pipe.in.ptr);
    Own<kj::AsyncOutputStream,_std::nullptr_t>::Own
              ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)this,other);
    OneWayPipe::~OneWayPipe((OneWayPipe *)local_b0);
    OVar2.ptr = extraout_RDX;
    OVar2.disposer = (Disposer *)this;
    return OVar2;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[43]>
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1bdf,FAILED,"statusCode < 200 || statusCode >= 300",
             "_kjCondition,\"the statusCode must not be 2xx for reject.\"",&local_39,
             (char (*) [43])"the statusCode must not be 2xx for reject.");
  kj::_::Debug::Fault::fatal(&local_80);
}

Assistant:

kj::Own<kj::AsyncOutputStream> reject(
        uint statusCode,
        kj::StringPtr statusText,
        const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
      KJ_REQUIRE(statusCode < 200 || statusCode >= 300,
          "the statusCode must not be 2xx for reject.");
      auto pipe = kj::newOneWayPipe();
      respond(statusCode, statusText, headers, kj::mv(pipe.in));
      return kj::mv(pipe.out);
    }